

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  int *piVar1;
  char *pcVar2;
  ImFontConfig *pIVar3;
  void *pvVar4;
  ImFont **ppIVar5;
  ImFont *pIVar6;
  ImFontConfig *pIVar7;
  ImGuiContext *pIVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  
  iVar9 = (this->ConfigData).Size;
  if (0 < iVar9) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      pIVar8 = GImGui;
      pIVar3 = (this->ConfigData).Data;
      pvVar4 = *(void **)(pIVar3->Name + lVar10 + -0x3a);
      if ((pvVar4 != (void *)0x0) && (pIVar3->Name[lVar10 + -0x2e] == '\x01')) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar8->IO).MemFreeFn)(pvVar4);
        if ((this->ConfigData).Size <= lVar11) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                        ,0x353,
                        "value_type &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]");
        }
        pcVar2 = ((this->ConfigData).Data)->Name + lVar10 + -0x3a;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
      }
      lVar11 = lVar11 + 1;
      iVar9 = (this->ConfigData).Size;
      lVar10 = lVar10 + 0x68;
    } while (lVar11 < iVar9);
  }
  lVar10 = (long)(this->Fonts).Size;
  if (0 < lVar10) {
    ppIVar5 = (this->Fonts).Data;
    pIVar3 = (this->ConfigData).Data;
    lVar11 = 0;
    do {
      pIVar6 = ppIVar5[lVar11];
      pIVar7 = pIVar6->ConfigData;
      if ((pIVar3 <= pIVar7) && (pIVar7 < pIVar3 + iVar9)) {
        pIVar6->ConfigData = (ImFontConfig *)0x0;
        ppIVar5[lVar11]->ConfigDataCount = 0;
      }
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  pIVar3 = (this->ConfigData).Data;
  if (pIVar3 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    pIVar8 = GImGui;
    (this->ConfigData).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar8->IO).MemFreeFn)(pIVar3);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            ImGui::MemFree(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
}